

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O3

void __thiscall defyx::JitCompilerX86::h_IMUL_R(JitCompilerX86 *this,Instruction *instr,int i)

{
  byte bVar1;
  int iVar2;
  uint8_t *puVar3;
  
  bVar1 = instr->dst;
  this->registerUsage[bVar1] = i;
  puVar3 = this->code + this->codePos;
  if (instr->src == bVar1) {
    puVar3[0] = 'M';
    puVar3[1] = 'i';
    iVar2 = this->codePos + 2;
    this->codePos = iVar2;
    this->code[iVar2] = instr->dst * '\t' + 0xc0;
    iVar2 = this->codePos;
    this->codePos = iVar2 + 1;
    *(uint32_t *)(this->code + (long)iVar2 + 1) = instr->imm32;
    iVar2 = 4;
  }
  else {
    puVar3[2] = 0xaf;
    puVar3[0] = 'M';
    puVar3[1] = '\x0f';
    iVar2 = this->codePos + 3;
    this->codePos = iVar2;
    this->code[iVar2] = instr->dst * '\b' + instr->src + 0xc0;
    iVar2 = 1;
  }
  this->codePos = this->codePos + iVar2;
  return;
}

Assistant:

void JitCompilerX86::h_IMUL_R(Instruction& instr, int i) {
		registerUsage[instr.dst] = i;
		if (instr.src != instr.dst) {
			emit(REX_IMUL_RR);
			emitByte(0xc0 + 8 * instr.dst + instr.src);
		}
		else {
			emit(REX_IMUL_RRI);
			emitByte(0xc0 + 9 * instr.dst);
			emit32(instr.getImm32());
		}
	}